

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O3

void __thiscall
icu_63::double_conversion::Bignum::AssignPowerUInt16(Bignum *this,uint16_t base,int power_exponent)

{
  uint *puVar1;
  uint uVar2;
  uint64_t value;
  long lVar3;
  ulong value_00;
  uint64_t uVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint factor;
  bool bVar9;
  
  value_00 = (ulong)base;
  if (power_exponent == 0) {
    puVar1 = (this->bigits_).start_;
    if (0 < this->used_digits_) {
      lVar3 = 0;
      do {
        puVar1[lVar3] = 0;
        lVar3 = lVar3 + 1;
      } while (lVar3 < this->used_digits_);
    }
    this->exponent_ = 0;
    *puVar1 = 1;
    this->used_digits_ = 1;
    return;
  }
  if (0 < this->used_digits_) {
    puVar1 = (this->bigits_).start_;
    lVar3 = 0;
    do {
      puVar1[lVar3] = 0;
      lVar3 = lVar3 + 1;
    } while (lVar3 < this->used_digits_);
  }
  this->used_digits_ = 0;
  this->exponent_ = 0;
  if ((base & 1) == 0) {
    iVar8 = 0;
    do {
      value_00 = value_00 >> 1;
      iVar8 = iVar8 + 1;
      factor = (uint)value_00;
    } while ((value_00 & 1) == 0);
  }
  else {
    factor = (uint)base;
    iVar8 = 0;
  }
  uVar2 = 0x1f;
  if (factor != 0) {
    for (; factor >> uVar2 == 0; uVar2 = uVar2 - 1) {
    }
  }
  if (0xde3 < (int)((0x20 - (uVar2 ^ 0x1f)) * power_exponent)) {
    abort();
  }
  uVar6 = 1;
  do {
    uVar7 = uVar6;
    uVar6 = uVar7 * 2;
  } while ((int)uVar7 <= power_exponent);
  uVar6 = (int)uVar7 >> 2;
  if (uVar7 < 4) {
    AssignUInt64(this,value_00);
  }
  else {
    bVar5 = false;
    value = value_00;
    uVar7 = uVar6;
    do {
      value = value * value;
      if ((uVar7 & power_exponent) != 0) {
        bVar9 = value >> ((byte)(uVar2 ^ 0x1f) & 0x3f | 0x20) != 0;
        uVar4 = 1;
        if (!bVar9) {
          uVar4 = value_00;
        }
        value = value * uVar4;
        bVar5 = (bool)(bVar5 | bVar9);
      }
      uVar6 = (int)uVar7 >> 1;
    } while ((1 < uVar7) && (uVar7 = uVar6, value >> 0x20 == 0));
    AssignUInt64(this,value);
    if (bVar5) {
      MultiplyByUInt32(this,factor);
    }
  }
  if (uVar6 != 0) {
    do {
      Square(this);
      if ((uVar6 & power_exponent) != 0) {
        MultiplyByUInt32(this,factor);
      }
      bVar5 = 1 < uVar6;
      uVar6 = (int)uVar6 >> 1;
    } while (bVar5);
  }
  ShiftLeft(this,iVar8 * power_exponent);
  return;
}

Assistant:

void Bignum::AssignPowerUInt16(uint16_t base, int power_exponent) {
  ASSERT(base != 0);
  ASSERT(power_exponent >= 0);
  if (power_exponent == 0) {
    AssignUInt16(1);
    return;
  }
  Zero();
  int shifts = 0;
  // We expect base to be in range 2-32, and most often to be 10.
  // It does not make much sense to implement different algorithms for counting
  // the bits.
  while ((base & 1) == 0) {
    base >>= 1;
    shifts++;
  }
  int bit_size = 0;
  int tmp_base = base;
  while (tmp_base != 0) {
    tmp_base >>= 1;
    bit_size++;
  }
  int final_size = bit_size * power_exponent;
  // 1 extra bigit for the shifting, and one for rounded final_size.
  EnsureCapacity(final_size / kBigitSize + 2);

  // Left to Right exponentiation.
  int mask = 1;
  while (power_exponent >= mask) mask <<= 1;

  // The mask is now pointing to the bit above the most significant 1-bit of
  // power_exponent.
  // Get rid of first 1-bit;
  mask >>= 2;
  uint64_t this_value = base;

  bool delayed_multipliciation = false;
  const uint64_t max_32bits = 0xFFFFFFFF;
  while (mask != 0 && this_value <= max_32bits) {
    this_value = this_value * this_value;
    // Verify that there is enough space in this_value to perform the
    // multiplication.  The first bit_size bits must be 0.
    if ((power_exponent & mask) != 0) {
      uint64_t base_bits_mask =
          ~((static_cast<uint64_t>(1) << (64 - bit_size)) - 1);
      bool high_bits_zero = (this_value & base_bits_mask) == 0;
      if (high_bits_zero) {
        this_value *= base;
      } else {
        delayed_multipliciation = true;
      }
    }
    mask >>= 1;
  }
  AssignUInt64(this_value);
  if (delayed_multipliciation) {
    MultiplyByUInt32(base);
  }

  // Now do the same thing as a bignum.
  while (mask != 0) {
    Square();
    if ((power_exponent & mask) != 0) {
      MultiplyByUInt32(base);
    }
    mask >>= 1;
  }

  // And finally add the saved shifts.
  ShiftLeft(shifts * power_exponent);
}